

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<short,long>(BaseAppender *this,Vector *col,short input)

{
  bool bVar1;
  unkbyte10 Var2;
  long result;
  int64_t local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<short,long>(input,&local_40,false);
  if (bVar1) {
    *(int64_t *)(col->data + (this->chunk).count * 8) = local_40;
    return;
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,long>
            (&local_38,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}